

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex frameIndex,MatrixDynSize *outJacobianPattern)

{
  bool bVar1;
  MatrixStorageOrdering local_54;
  MatrixView<double> local_50;
  
  getNrOfDegreesOfFreedom(this);
  iDynTree::MatrixDynSize::resize((ulong)outJacobianPattern,6);
  local_54 = RowMajor;
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>(&local_50,outJacobianPattern,&local_54)
  ;
  bVar1 = getFrameFreeFloatingJacobianSparsityPattern(this,frameIndex,&local_50);
  return bVar1;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern(const FrameIndex frameIndex,
                                                                         iDynTree::MatrixDynSize & outJacobianPattern) const
    {
        outJacobianPattern.resize(6, 6 + getNrOfDegreesOfFreedom());

        return this->getFrameFreeFloatingJacobianSparsityPattern(frameIndex,
                                                                 MatrixView<double>(outJacobianPattern));
    }